

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_trans_double_path.cpp
# Opt level: O0

void __thiscall agg::trans_double_path::trans_double_path(trans_double_path *this)

{
  trans_double_path *this_local;
  
  vertex_sequence<agg::vertex_dist,_6U>::vertex_sequence(&this->m_src_vertices1);
  vertex_sequence<agg::vertex_dist,_6U>::vertex_sequence(&this->m_src_vertices2);
  this->m_base_length = 0.0;
  this->m_base_height = 1.0;
  this->m_kindex1 = 0.0;
  this->m_kindex2 = 0.0;
  this->m_status1 = initial;
  this->m_status2 = initial;
  this->m_preserve_x_scale = true;
  return;
}

Assistant:

trans_double_path::trans_double_path() :
        m_kindex1(0.0),
        m_kindex2(0.0),
        m_base_length(0.0),
        m_base_height(1.0),
        m_status1(initial),
        m_status2(initial),
        m_preserve_x_scale(true)
    {
    }